

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O0

void cmd_data_help_default(void)

{
  printf(
        "  -d MODE, --default=MODE\n                Print data with default values, according to the MODE\n                (to print attributes, ietf-netconf-with-defaults model\n                must be loaded):\n      all             - Add missing default nodes.\n      all-tagged      - Add missing default nodes and mark all the default\n                        nodes with the attribute.\n      trim            - Remove all nodes with a default value.\n      implicit-tagged - Add missing nodes and mark them with the attribute.\n"
        );
  return;
}

Assistant:

static void
cmd_data_help_default(void)
{
    printf("  -d MODE, --default=MODE\n"
            "                Print data with default values, according to the MODE\n"
            "                (to print attributes, ietf-netconf-with-defaults model\n"
            "                must be loaded):\n"
            "      all             - Add missing default nodes.\n"
            "      all-tagged      - Add missing default nodes and mark all the default\n"
            "                        nodes with the attribute.\n"
            "      trim            - Remove all nodes with a default value.\n"
            "      implicit-tagged - Add missing nodes and mark them with the attribute.\n");
}